

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  long lVar1;
  ImGuiWindow *pIVar2;
  ImDrawIdx *pIVar3;
  ImDrawVert *pIVar4;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImGuiContext *pIVar5;
  undefined1 auVar6 [16];
  ImDrawList *pIVar7;
  uint uVar8;
  ImU32 col_upr_right;
  ImU32 IVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined7 uVar10;
  char *text_end;
  char cVar11;
  ImVec2 *out_r;
  uint uVar12;
  byte bVar13;
  ImGuiContext *g;
  long lVar14;
  bool bVar15;
  uint uVar16;
  float fVar17;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  ImVec2 IVar18;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  int iVar19;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  int iVar20;
  undefined4 extraout_XMM0_Dd_01;
  undefined8 extraout_XMM0_Qb;
  ImVec2 p_max_01;
  ImVec2 p_max_02;
  ImVec2 half_sz;
  ImVec2 half_sz_00;
  float fVar21;
  float fVar22;
  float fVar23;
  float S;
  float V;
  ImVec2 picker_pos;
  ImVec2 wheel_center;
  float B;
  float G;
  float R;
  ImVec4 hue_color_f;
  ImVec2 sv_cursor_pos;
  ImVec2 triangle_pc;
  ImVec2 triangle_pb;
  ImVec2 triangle_pa;
  float uu;
  float ww;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  uint local_1f0;
  float local_1ec;
  float local_1e8;
  float local_1e4;
  uint local_1e0;
  uint local_1dc;
  ImVec2 local_1d8;
  float local_1cc;
  undefined1 local_1c8 [8];
  undefined8 uStack_1c0;
  ImVec2 local_1b0;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  undefined1 local_198 [8];
  uint uStack_190;
  uint uStack_18c;
  ImVec4 local_188;
  float local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  ImVec2 local_168;
  ImU32 local_15c;
  uint local_158;
  float local_154;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [12];
  float fStack_11c;
  float local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  ImVec2 local_108;
  int iStack_100;
  int iStack_fc;
  ImVec2 *local_f8;
  ImDrawList *local_f0;
  undefined1 local_e8 [16];
  ImVec2 local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  ImU32 local_ac;
  size_t local_a8;
  ImGuiWindow *local_a0;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems != false) {
    bVar13 = 0;
    goto LAB_0017ef66;
  }
  local_f0 = pIVar2->DrawList;
  local_108 = (ImVec2)ref_col;
  local_1c8._0_4_ = CalcItemWidth();
  local_1c8._4_4_ = extraout_XMM0_Db;
  uStack_1c0._0_4_ = extraout_XMM0_Dc;
  uStack_1c0._4_4_ = extraout_XMM0_Dd;
  (pIVar5->NextItemData).Flags = 0;
  PushID(label);
  BeginGroup();
  uVar12 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(col,uVar12);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar8 = pIVar5->ColorEditOptions & 0x6000000;
    uVar16 = 0x2000000;
    if (uVar8 != 0) {
      uVar16 = uVar8;
    }
    uVar12 = uVar12 | uVar16;
  }
  if ((uVar12 & 0x18000000) == 0) {
    uVar8 = pIVar5->ColorEditOptions & 0x18000000;
    uVar16 = 0x8000000;
    if (uVar8 != 0) {
      uVar16 = uVar8;
    }
    uVar12 = uVar12 | uVar16;
  }
  uVar16 = (uVar12 & 0x6000000) - 1;
  if ((uVar12 & 0x6000000 ^ uVar16) <= uVar16) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115d,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  uVar16 = (uVar12 & 0x18000000) - 1;
  if ((uVar12 & 0x18000000 ^ uVar16) <= uVar16) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                  ,0x115e,
                  "bool ImGui::ColorPicker4(const char *, float *, ImGuiColorEditFlags, const float *)"
                 );
  }
  if ((uVar12 & 8) == 0) {
    uVar12 = uVar12 | pIVar5->ColorEditOptions & 0x10000U;
  }
  local_158 = uVar12 & 0x10002;
  bVar15 = local_158 == 0x10000;
  local_1d8 = (pIVar2->DC).CursorPos;
  local_f8 = (ImVec2 *)col;
  local_a0 = pIVar2;
  local_118 = GetFrameHeight();
  out_r = local_f8;
  fVar17 = (pIVar5->Style).ItemInnerSpacing.x;
  local_e8 = ZEXT416((uint)fVar17);
  fVar21 = (float)local_1c8._0_4_ - (local_118 + fVar17) * (float)(byte)(bVar15 + 1);
  uVar16 = -(uint)(fVar21 <= local_118);
  uStack_174 = local_1c8._4_4_ & extraout_XMM0_Db_00;
  uStack_170 = (uint)uStack_1c0 & extraout_XMM0_Dc_00;
  uStack_16c = uStack_1c0._4_4_ & extraout_XMM0_Dd_00;
  local_178 = (float)(uVar16 & (uint)local_118 | ~uVar16 & (uint)fVar21);
  local_1c8._0_4_ = local_1d8.x;
  _local_198 = ZEXT416((uint)(local_1d8.x + local_178 + fVar17));
  local_a8 = (ulong)((uVar12 & 2) == 0) * 4 + 0xc;
  uStack_114 = extraout_XMM0_Db_00;
  uStack_110 = extraout_XMM0_Dc_00;
  uStack_10c = extraout_XMM0_Dd_00;
  memcpy(local_58,local_f8,local_a8);
  local_1cc = local_178 * 0.08;
  local_98 = local_178 * 0.5;
  local_1b0.x = (local_118 + local_178) * 0.5 + (float)local_1c8._0_4_;
  uStack_94 = uStack_174;
  uStack_90 = uStack_170;
  uStack_8c = uStack_16c;
  local_1b0.y = local_1d8.y + local_98;
  local_1c8._4_4_ = uStack_174;
  local_1c8._0_4_ = local_98 - local_1cc;
  uStack_1c0._0_4_ = uStack_170;
  uStack_1c0._4_4_ = uStack_16c;
  local_140.x = (local_98 - local_1cc) - (float)(int)(local_178 * 0.027);
  local_140.y = 0.0;
  local_150.x = local_140.x * -0.5;
  local_148.y = local_140.x * -0.866025;
  local_150.y = local_140.x * 0.866025;
  local_1ec = out_r->x;
  local_1e8 = out_r->y;
  local_1e4 = out_r[1].x;
  local_1a4 = local_1e4;
  local_1a0 = local_1e8;
  local_19c = local_1ec;
  local_148.x = local_150.x;
  if ((uVar12 >> 0x1b & 1) == 0) {
    if ((uVar12 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_1ec,local_1e8,local_1e4,&local_19c,&local_1a0,&local_1a4);
    }
  }
  else {
    ColorConvertRGBtoHSV(local_1ec,local_1e8,local_1e4,&local_1ec,&local_1e8,&local_1e4);
  }
  local_138._4_4_ = uStack_114;
  local_138._0_4_ = local_118 + (float)local_198._0_4_;
  local_138._8_4_ = uStack_110;
  local_138._12_4_ = uStack_10c;
  PushItemFlag(8,true);
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((uVar12 >> 0x19 & 1) == 0) {
      local_1dc = 0;
      local_1e0 = 0;
      local_1f0 = 0;
    }
    else {
      local_188.y = local_178;
      local_188.x = local_178;
      InvisibleButton("sv",(ImVec2 *)&local_188);
      bVar15 = IsItemActive();
      if (bVar15) {
        fVar17 = ((pIVar5->IO).MousePos.x - local_1d8.x) / (local_178 + -1.0);
        local_1e8 = 1.0;
        if (fVar17 <= 1.0) {
          local_1e8 = fVar17;
        }
        local_1e8 = (float)(~-(uint)(fVar17 < 0.0) & (uint)local_1e8);
        fVar21 = ((pIVar5->IO).MousePos.y - local_1d8.y) / (local_178 + -1.0);
        fVar17 = 1.0;
        if (fVar21 <= 1.0) {
          fVar17 = fVar21;
        }
        local_1e4 = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar17));
        local_1dc = (uint)CONCAT71(extraout_var,1);
      }
      else {
        local_1dc = 0;
      }
      if ((uVar12 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
      }
      local_188.y = local_1d8.y;
      local_188.x = (float)local_198._0_4_;
      SetCursorScreenPos((ImVec2 *)&local_188);
      local_188.y = local_178;
      local_188.x = local_118;
      InvisibleButton("hue",(ImVec2 *)&local_188);
      bVar15 = IsItemActive();
      if (bVar15) {
        fVar17 = ((pIVar5->IO).MousePos.y - local_1d8.y) / (local_178 + -1.0);
        local_1ec = 1.0;
        if (fVar17 <= 1.0) {
          local_1ec = fVar17;
        }
        local_1ec = (float)(~-(uint)(fVar17 < 0.0) & (uint)local_1ec);
        local_1e0 = (uint)CONCAT71(extraout_var_00,1);
        local_1f0 = (uint)CONCAT71(extraout_var_00,1);
      }
      else {
        local_1e0 = 0;
        local_1f0 = local_1dc;
      }
    }
  }
  else {
    local_188.y = local_178;
    local_188.x = (pIVar5->Style).ItemInnerSpacing.x + local_178 + local_118;
    InvisibleButton("hsv",(ImVec2 *)&local_188);
    bVar15 = IsItemActive();
    if (bVar15) {
      fVar21 = (pIVar5->IO).MouseClickedPos[0].x - local_1b0.x;
      local_78 = ZEXT416((uint)fVar21);
      local_1a8 = (pIVar5->IO).MouseClickedPos[0].y - local_1b0.y;
      fVar17 = (pIVar5->IO).MousePos.x - local_1b0.x;
      local_88 = ZEXT416((uint)fVar17);
      local_154 = (pIVar5->IO).MousePos.y - local_1b0.y;
      fVar21 = fVar21 * fVar21 + local_1a8 * local_1a8;
      if ((fVar21 < ((float)local_1c8._0_4_ + -1.0) * ((float)local_1c8._0_4_ + -1.0)) ||
         ((local_98 + 1.0) * (local_98 + 1.0) < fVar21)) {
        local_1e0 = 0;
      }
      else {
        fVar17 = atan2f(local_154,fVar17);
        fVar17 = (fVar17 / 3.1415927) * 0.5;
        local_1ec = (float)(~-(uint)(fVar17 < 0.0) & (uint)fVar17 |
                           (uint)(fVar17 + 1.0) & -(uint)(fVar17 < 0.0));
        local_1e0 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_c8 = cosf(local_1ec * -2.0 * 3.1415927);
      fVar17 = sinf(local_1ec * -2.0 * 3.1415927);
      local_188.x = (float)local_78._0_4_ * local_c8 - fVar17 * local_1a8;
      local_188.y = (float)local_78._0_4_ * fVar17 + local_1a8 * local_c8;
      local_1a8 = fVar17;
      bVar15 = ImTriangleContainsPoint(&local_140,&local_148,&local_150,(ImVec2 *)&local_188);
      if (bVar15) {
        local_188.x = (float)local_88._0_4_ * local_c8 - local_1a8 * local_154;
        local_188.y = (float)local_88._0_4_ * local_1a8 + local_154 * local_c8;
        bVar15 = ImTriangleContainsPoint(&local_140,&local_148,&local_150,(ImVec2 *)&local_188);
        if (!bVar15) {
          local_188._0_8_ =
               ImTriangleClosestPoint(&local_140,&local_148,&local_150,(ImVec2 *)&local_188);
        }
        ImTriangleBarycentricCoords
                  (&local_140,&local_148,&local_150,(ImVec2 *)&local_188,(float *)local_128,
                   &local_168.x,&local_d0.x);
        fVar21 = 1.0 - local_168.x;
        fVar17 = 1.0;
        if (fVar21 <= 1.0) {
          fVar17 = fVar21;
        }
        local_1e4 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar17);
        fVar21 = (float)local_128._0_4_ / local_1e4;
        fVar17 = 1.0;
        if (fVar21 <= 1.0) {
          fVar17 = fVar21;
        }
        local_1e8 = (float)(-(uint)(fVar21 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar21 < 0.0001) & (uint)fVar17);
        uVar10 = (undefined7)((ulong)extraout_RAX_00 >> 8);
        local_1dc = (uint)CONCAT71(uVar10,1);
        local_1f0 = (uint)CONCAT71(uVar10,1);
        out_r = local_f8;
      }
      else {
        local_1dc = 0;
        local_1f0 = local_1e0;
      }
    }
    else {
      local_1dc = 0;
      local_1e0 = 0;
      local_1f0 = 0;
    }
    if ((uVar12 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_e8._0_4_ = (float)local_e8._0_4_ + (float)local_138._0_4_;
  if (local_158 == 0x10000) {
    local_188.y = local_1d8.y;
    local_188.x = (float)local_e8._0_4_;
    SetCursorScreenPos((ImVec2 *)&local_188);
    local_188.y = local_178;
    local_188.x = local_118;
    InvisibleButton("alpha",(ImVec2 *)&local_188);
    bVar15 = IsItemActive();
    if (bVar15) {
      fVar21 = ((pIVar5->IO).MousePos.y - local_1d8.y) / (local_178 + -1.0);
      fVar17 = 1.0;
      if (fVar21 <= 1.0) {
        fVar17 = fVar21;
      }
      out_r[1].y = (float)(-(uint)(fVar21 < 0.0) & 0x3f800000 |
                          ~-(uint)(fVar21 < 0.0) & (uint)(1.0 - fVar17));
      local_1f0 = 1;
    }
  }
  PopItemFlag();
  if ((uVar12 >> 8 & 1) == 0) {
    SameLine(0.0,(pIVar5->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  if ((-1 < (char)uVar12) && (text_end = FindRenderedTextEnd(label,(char *)0x0), text_end != label))
  {
    if ((uVar12 >> 8 & 1) != 0) {
      SameLine(0.0,(pIVar5->Style).ItemInnerSpacing.x);
    }
    TextEx(label,text_end,0);
  }
  if ((uVar12 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    IVar18 = local_108;
    local_188._0_8_ = *out_r;
    if ((uVar12 & 2) == 0) {
      local_188.w = out_r[1].y;
    }
    else {
      local_188.w = 1.0;
    }
    local_188.z = out_r[1].x;
    if ((char)uVar12 < '\0') {
      Text("Current");
    }
    local_108.x = local_118 * 3.0;
    local_108.y = local_118 + local_118;
    local_f8 = (ImVec2 *)((ulong)uStack_114 << 0x20);
    ColorButton("##current",&local_188,uVar12 & 0x180e0040,local_108);
    if (IVar18 != (ImVec2)0x0) {
      Text("Original");
      local_128._0_8_ = *(undefined8 *)IVar18;
      local_128._8_4_ = *(float *)((long)IVar18 + 8);
      if ((uVar12 & 2) == 0) {
        fStack_11c = *(float *)((long)IVar18 + 0xc);
      }
      else {
        fStack_11c = 1.0;
      }
      bVar15 = ColorButton("##original",(ImVec4 *)local_128,uVar12 & 0x180e0040,local_108);
      if (bVar15) {
        memcpy(out_r,(void *)IVar18,local_a8);
        local_1f0 = 1;
      }
    }
    PopItemFlag();
    EndGroup();
  }
  IVar18 = (ImVec2)&out_r->y;
  if (((char)local_1e0 != '\0') || ((char)local_1dc != '\0')) {
    if ((uVar12 >> 0x1b & 1) == 0) {
      if ((uVar12 >> 0x1c & 1) != 0) {
        out_r->x = local_1ec;
        out_r->y = local_1e8;
        out_r[1].x = local_1e4;
      }
    }
    else {
      ColorConvertHSVtoRGB
                ((float)(~-(uint)(1.0 <= local_1ec) & (uint)local_1ec |
                        (uint)(local_1ec + -1e-05) & -(uint)(1.0 <= local_1ec)),
                 (float)(~-(uint)(0.0 < local_1e8) & 0x3727c5ac |
                        (uint)local_1e8 & -(uint)(0.0 < local_1e8)),
                 (float)(~-(uint)(0.0 < local_1e4) & 0x358637bd |
                        (uint)local_1e4 & -(uint)(0.0 < local_1e4)),&out_r->x,(float *)IVar18,
                 &out_r[1].x);
    }
  }
  fVar17 = local_118 * 0.2;
  fVar21 = 0.0;
  fVar22 = 0.0;
  fVar23 = 0.0;
  cVar11 = '\x01';
  if ((uVar12 & 0x20) == 0) {
    fStack_c4 = 0.0;
    fStack_c0 = 0.0;
    fStack_bc = 0.0;
    fVar21 = (float)local_e8._0_4_;
    if (local_158 != 0x10000) {
      fVar21 = (float)local_198._0_4_;
    }
    local_108 = IVar18;
    local_c8 = fVar17;
    PushItemWidth((fVar21 + local_118) - local_1d8.x);
    uVar16 = uVar12 & 0x198e001a;
    cVar11 = '\x01';
    if (((uVar12 >> 0x14 & 1) != 0 || (uVar12 & 0x600000) == 0) &&
       (bVar15 = ColorEdit4("##rgb",&out_r->x,uVar16 | 0x100004), bVar15)) {
      local_1f0 = 1;
      if (pIVar5->ActiveId == 0) {
        cVar11 = '\x01';
      }
      else {
        cVar11 = pIVar5->ActiveIdAllowOverlap;
      }
    }
    if ((uVar12 >> 0x15 & 1) != 0 || (uVar12 & 0x500000) == 0) {
      bVar15 = ColorEdit4("##hsv",&out_r->x,uVar16 | 0x200004);
      local_1f0 = (uint)(byte)((byte)local_1f0 | bVar15);
    }
    if ((uVar12 >> 0x16 & 1) != 0 || (uVar12 & 0x300000) == 0) {
      bVar15 = ColorEdit4("##hex",&out_r->x,uVar16 | 0x400004);
      local_1f0 = (uint)(byte)((byte)local_1f0 | bVar15);
    }
    PopItemWidth();
    IVar18 = local_108;
    fVar17 = local_c8;
    fVar21 = fStack_c4;
    fVar22 = fStack_c0;
    fVar23 = fStack_bc;
  }
  fVar17 = (float)(int)fVar17;
  fVar21 = (float)(int)fVar21;
  iVar19 = (int)fVar22;
  iVar20 = (int)fVar23;
  if (((uVar12 >> 0x1b & 1) != 0) && (cVar11 == '\0')) {
    local_108.y = fVar21;
    local_108.x = fVar17;
    iStack_100 = iVar19;
    iStack_fc = iVar20;
    ColorConvertRGBtoHSV(out_r->x,out_r->y,out_r[1].x,&local_188.x,(float *)local_128,&local_168.x);
    if ((local_188.x <= 0.0) && (0.0 < local_1ec)) {
      if (0.0 < local_168.x) {
LAB_0017e205:
        if (0.0 < (float)local_128._0_4_) goto LAB_0017e22b;
        fVar17 = local_1e8 * 0.5;
      }
      else {
        if ((local_1e4 == local_168.x) && (!NAN(local_1e4) && !NAN(local_168.x))) goto LAB_0017e205;
        local_168.x = local_1e4 * 0.5;
        fVar17 = local_1e8;
      }
      ColorConvertHSVtoRGB(local_1ec,fVar17,local_168.x,&out_r->x,(float *)IVar18,&out_r[1].x);
    }
LAB_0017e22b:
    fVar17 = local_108.x;
    fVar21 = local_108.y;
    iVar19 = iStack_100;
    iVar20 = iStack_fc;
  }
  local_68 = (float)(int)fVar17;
  fStack_64 = (float)(int)fVar21;
  fStack_60 = (float)iVar19;
  fStack_5c = (float)iVar20;
  if ((char)local_1f0 != '\0') {
    if ((uVar12 >> 0x1b & 1) == 0) {
      if ((uVar12 >> 0x1c & 1) != 0) {
        local_1ec = out_r->x;
        local_1e8 = out_r->y;
        local_1e4 = out_r[1].x;
        ColorConvertHSVtoRGB(local_1ec,local_1e8,local_1e4,&local_19c,&local_1a0,&local_1a4);
      }
    }
    else {
      local_19c = out_r->x;
      local_1a0 = out_r->y;
      local_1a4 = out_r[1].x;
      ColorConvertRGBtoHSV(local_19c,local_1a0,local_1a4,&local_1ec,&local_1e8,&local_1e4);
    }
  }
  local_188.x = 1.0;
  local_188.y = 1.0;
  local_188.z = 1.0;
  local_188.w = 1.0;
  ColorConvertHSVtoRGB
            (local_1ec,1.0,1.0,&local_188.x,(float *)((long)&local_188 + 4),
             (float *)((long)&local_188 + 8));
  col_upr_right = ColorConvertFloat4ToU32(&local_188);
  local_128._4_4_ = local_1a0;
  local_128._0_4_ = local_19c;
  local_128._8_4_ = local_1a4;
  fStack_11c = 1.0;
  IVar9 = ColorConvertFloat4ToU32((ImVec4 *)local_128);
  pIVar7 = local_f0;
  local_168.x = 0.0;
  local_168.y = 0.0;
  if ((uVar12 >> 0x1a & 1) == 0) {
    if ((uVar12 >> 0x19 & 1) != 0) {
      local_128._0_4_ = local_1d8.x + local_178;
      local_128._4_4_ = local_1d8.y + local_178;
      local_15c = IVar9;
      ImDrawList::AddRectFilledMultiColor
                (local_f0,&local_1d8,(ImVec2 *)local_128,0xffffffff,col_upr_right,col_upr_right,
                 0xffffffff);
      local_128._0_4_ = local_1d8.x + local_178;
      local_128._4_4_ = local_1d8.y + local_178;
      ImDrawList::AddRectFilledMultiColor
                (pIVar7,&local_1d8,(ImVec2 *)local_128,0,0,0xff000000,0xff000000);
      p_max_01.x = local_1d8.x + local_178;
      p_max_01.y = local_1d8.y + local_178;
      RenderFrameBorder(local_1d8,p_max_01,0.0);
      fVar17 = 1.0;
      if (local_1e8 <= 1.0) {
        fVar17 = local_1e8;
      }
      fVar21 = (float)(int)((float)(~-(uint)(local_1e8 < 0.0) & (uint)fVar17) * local_178 +
                            local_1d8.x + 0.5);
      fVar17 = local_178 + local_1d8.x + -2.0;
      if (fVar21 <= fVar17) {
        fVar17 = fVar21;
      }
      uVar12 = -(uint)(fVar21 < local_1d8.x + 2.0);
      fVar22 = 1.0 - local_1e4;
      fVar21 = 1.0;
      if (fVar22 <= 1.0) {
        fVar21 = fVar22;
      }
      fVar22 = (float)(int)((float)(~-(uint)(fVar22 < 0.0) & (uint)fVar21) * local_178 + local_1d8.y
                           + 0.5);
      fVar21 = local_1d8.y + local_178 + -2.0;
      if (fVar22 <= fVar21) {
        fVar21 = fVar22;
      }
      uVar16 = -(uint)(fVar22 < local_1d8.y + 2.0);
      local_168.y = (float)(uVar16 & (uint)(local_1d8.y + 2.0) | ~uVar16 & (uint)fVar21);
      local_168.x = (float)(uVar12 & (uint)(local_1d8.x + 2.0) | ~uVar12 & (uint)fVar17);
      local_1c8._0_4_ = local_178 / 6.0;
      lVar14 = 0;
      do {
        lVar1 = lVar14 + 1;
        local_128._4_4_ = (float)(int)lVar14 * (float)local_1c8._0_4_ + local_1d8.y;
        local_128._0_4_ = local_198._0_4_;
        local_d0.y = (float)(int)lVar1 * (float)local_1c8._0_4_ + local_1d8.y;
        local_d0.x = (float)local_138._0_4_;
        ImDrawList::AddRectFilledMultiColor
                  (pIVar7,(ImVec2 *)local_128,&local_d0,(&DAT_001a34b0)[lVar14],
                   (&DAT_001a34b0)[lVar14],(&DAT_001a34b4)[lVar14],(&DAT_001a34b4)[lVar14]);
        lVar14 = lVar1;
      } while (lVar1 != 6);
      _local_1c8 = ZEXT416((uint)(float)(int)(local_1ec * local_178 + local_1d8.y + 0.5));
      p_min.y = local_1d8.y;
      p_min.x = (float)local_198._0_4_;
      p_max_02.y = local_178 + local_1d8.y;
      p_max_02.x = (float)local_138._0_4_;
      RenderFrameBorder(p_min,p_max_02,0.0);
      pos.x = (float)local_198._0_4_ + -1.0;
      pos.y = (float)local_1c8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar(pIVar7,pos,half_sz,local_118 + 2.0);
      out_r = local_f8;
      IVar9 = local_15c;
    }
  }
  else {
    local_78 = ZEXT416((uint)(1.5 / local_98));
    local_1a8 = 5.60519e-45;
    if (4 < (int)local_98 / 0xc) {
      local_1a8 = (float)((int)local_98 / 0xc);
    }
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -(1.5 / local_98);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_98 = local_98 + (float)local_1c8._0_4_;
    local_154 = local_98 * 0.5;
    lVar14 = 0;
    local_15c = IVar9;
    local_ac = col_upr_right;
    do {
      fVar17 = (float)(int)lVar14 / 6.0;
      fVar17 = (fVar17 + fVar17) * 3.1415927 + (float)local_88._0_4_;
      local_138._0_4_ = fVar17;
      fVar21 = ((float)(int)lVar14 + 1.0) / 6.0;
      fVar21 = (fVar21 + fVar21) * 3.1415927 + (float)local_78._0_4_;
      local_108.x = fVar21;
      iVar19 = (pIVar7->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar7,&local_1b0,local_154,fVar17,fVar21,(int)local_1a8);
      ImDrawList::AddPolyline
                (pIVar7,(pIVar7->_Path).Data,(pIVar7->_Path).Size,0xffffffff,false,local_1cc);
      (pIVar7->_Path).Size = 0;
      iVar20 = (pIVar7->VtxBuffer).Size;
      local_198._0_4_ = local_1b0.x;
      fVar17 = cosf((float)local_138._0_4_);
      local_198._4_4_ = extraout_XMM0_Db_01;
      local_198._0_4_ = fVar17 * (float)local_1c8._0_4_ + (float)local_198._0_4_;
      uStack_190 = extraout_XMM0_Dc_01;
      uStack_18c = extraout_XMM0_Dd_01;
      local_c8 = local_1b0.y;
      fVar17 = sinf((float)local_138._0_4_);
      uStack_190 = local_198._4_4_;
      local_198._4_4_ = fVar17 * (float)local_1c8._0_4_ + local_c8;
      uStack_18c = extraout_XMM0_Db_02;
      local_138 = ZEXT416((uint)local_1b0.x);
      fVar17 = cosf(local_108.x);
      local_138._0_4_ = (float)local_138._0_4_ + fVar17 * (float)local_1c8._0_4_;
      local_c8 = local_1b0.y;
      fVar17 = sinf(local_108.x);
      IVar18.y = fVar17 * (float)local_1c8._0_4_ + local_c8;
      IVar18.x = (float)local_138._0_4_;
      lVar1 = lVar14 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar7,iVar19,iVar20,(ImVec2)local_198,IVar18,(&DAT_001a34b0)[lVar14],
                 (&DAT_001a34b4)[lVar14]);
      lVar14 = lVar1;
    } while (lVar1 != 6);
    fVar17 = cosf((local_1ec + local_1ec) * 3.1415927);
    local_1c8._0_4_ = fVar17;
    fVar17 = sinf((local_1ec + local_1ec) * 3.1415927);
    IVar9 = local_ac;
    pIVar7 = local_f0;
    out_r = local_f8;
    local_198._0_4_ = fVar17;
    local_128._4_4_ = local_98 * fVar17 * 0.5 + local_1b0.y;
    local_128._0_4_ = local_98 * (float)local_1c8._0_4_ * 0.5 + local_1b0.x;
    if ((char)local_1e0 == '\0') {
      fVar17 = 0.55;
    }
    else {
      fVar17 = 0.65;
    }
    local_1cc = local_1cc * fVar17;
    iVar19 = 0x20;
    if ((int)(local_1cc / 1.4) < 0x20) {
      iVar19 = (int)(local_1cc / 1.4);
    }
    iVar20 = 9;
    if (9 < iVar19) {
      iVar20 = iVar19;
    }
    ImDrawList::AddCircleFilled(local_f0,(ImVec2 *)local_128,local_1cc,local_ac,iVar20);
    ImDrawList::AddCircle(pIVar7,(ImVec2 *)local_128,local_1cc + 1.0,0xff808080,iVar20,1.0);
    ImDrawList::AddCircle(pIVar7,(ImVec2 *)local_128,local_1cc,0xffffffff,iVar20,1.0);
    local_d0.x = (local_140.x * (float)local_1c8._0_4_ - (float)local_198._0_4_ * local_140.y) +
                 local_1b0.x;
    local_d0.y = local_140.x * (float)local_198._0_4_ + local_140.y * (float)local_1c8._0_4_ +
                 local_1b0.y;
    local_38.y = local_148.x * (float)local_198._0_4_ + local_148.y * (float)local_1c8._0_4_ +
                 local_1b0.y;
    local_38.x = (local_148.x * (float)local_1c8._0_4_ - (float)local_198._0_4_ * local_148.y) +
                 local_1b0.x;
    local_40.y = local_150.x * (float)local_198._0_4_ + (float)local_1c8._0_4_ * local_150.y +
                 local_1b0.y;
    local_40.x = (local_150.x * (float)local_1c8._0_4_ - (float)local_198._0_4_ * local_150.y) +
                 local_1b0.x;
    IVar18 = GetFontTexUvWhitePixel();
    uStack_1c0 = extraout_XMM0_Qb;
    local_1c8._0_4_ = IVar18.x;
    local_1c8._4_4_ = IVar18.y;
    ImDrawList::PrimReserve(pIVar7,6,6);
    auVar6 = _local_1c8;
    pIVar3 = pIVar7->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)pIVar7->_VtxCurrentIdx;
    pIVar7->_IdxWritePtr = pIVar3 + 1;
    pIVar7->_VtxWritePtr->pos = local_d0;
    pIVar4 = pIVar7->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1c8._0_4_;
    (pIVar4->uv).y = (float)local_1c8._4_4_;
    pIVar4 = pIVar7->_VtxWritePtr;
    pIVar4->col = IVar9;
    pIVar7->_VtxWritePtr = pIVar4 + 1;
    uVar12 = pIVar7->_VtxCurrentIdx + 1;
    pIVar7->_VtxCurrentIdx = uVar12;
    pIVar3 = pIVar7->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar12;
    pIVar7->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = pIVar7->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1c8._0_4_;
    (pIVar4->uv).y = (float)local_1c8._4_4_;
    pIVar4 = pIVar7->_VtxWritePtr;
    pIVar4->col = IVar9;
    pIVar7->_VtxWritePtr = pIVar4 + 1;
    uVar12 = pIVar7->_VtxCurrentIdx + 1;
    pIVar7->_VtxCurrentIdx = uVar12;
    pIVar3 = pIVar7->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar12;
    pIVar7->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = pIVar7->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1c8._0_4_;
    (pIVar4->uv).y = (float)local_1c8._4_4_;
    pIVar4 = pIVar7->_VtxWritePtr;
    pIVar4->col = 0xffffffff;
    pIVar7->_VtxWritePtr = pIVar4 + 1;
    uVar12 = pIVar7->_VtxCurrentIdx + 1;
    pIVar7->_VtxCurrentIdx = uVar12;
    pIVar3 = pIVar7->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar12;
    pIVar7->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_d0;
    pIVar4 = pIVar7->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1c8._0_4_;
    (pIVar4->uv).y = (float)local_1c8._4_4_;
    pIVar4 = pIVar7->_VtxWritePtr;
    pIVar4->col = 0;
    pIVar7->_VtxWritePtr = pIVar4 + 1;
    uVar12 = pIVar7->_VtxCurrentIdx + 1;
    pIVar7->_VtxCurrentIdx = uVar12;
    pIVar3 = pIVar7->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar12;
    pIVar7->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_38;
    pIVar4 = pIVar7->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1c8._0_4_;
    (pIVar4->uv).y = (float)local_1c8._4_4_;
    pIVar4 = pIVar7->_VtxWritePtr;
    pIVar4->col = 0xff000000;
    pIVar7->_VtxWritePtr = pIVar4 + 1;
    uVar12 = pIVar7->_VtxCurrentIdx + 1;
    pIVar7->_VtxCurrentIdx = uVar12;
    pIVar3 = pIVar7->_IdxWritePtr;
    *pIVar3 = (ImDrawIdx)uVar12;
    pIVar7->_IdxWritePtr = pIVar3 + 1;
    pIVar4[1].pos = local_40;
    pIVar4 = pIVar7->_VtxWritePtr;
    (pIVar4->uv).x = (float)local_1c8._0_4_;
    (pIVar4->uv).y = (float)local_1c8._4_4_;
    pIVar4 = pIVar7->_VtxWritePtr;
    pIVar4->col = 0;
    pIVar7->_VtxWritePtr = pIVar4 + 1;
    pIVar7->_VtxCurrentIdx = pIVar7->_VtxCurrentIdx + 1;
    _local_1c8 = auVar6;
    ImDrawList::AddTriangle(pIVar7,&local_d0,&local_38,&local_40,0xff808080,1.5);
    fVar17 = 1.0;
    if (local_1e8 <= 1.0) {
      fVar17 = local_1e8;
    }
    fVar17 = (float)(~-(uint)(local_1e8 < 0.0) & (uint)fVar17);
    fVar23 = (local_d0.x - local_40.x) * fVar17 + local_40.x;
    fVar21 = (local_d0.y - local_40.y) * fVar17 + local_40.y;
    fVar22 = 1.0 - local_1e4;
    fVar17 = 1.0;
    if (fVar22 <= 1.0) {
      fVar17 = fVar22;
    }
    fVar17 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar17);
    local_168.x = (local_38.x - fVar23) * fVar17 + fVar23;
    local_168.y = (local_38.y - fVar21) * fVar17 + fVar21;
    IVar9 = local_15c;
  }
  pIVar7 = local_f0;
  if ((char)local_1dc == '\0') {
    fVar17 = 6.0;
  }
  else {
    fVar17 = 10.0;
  }
  local_1c8._0_4_ = fVar17;
  ImDrawList::AddCircleFilled(local_f0,&local_168,fVar17,IVar9,0xc);
  ImDrawList::AddCircle(pIVar7,&local_168,(float)local_1c8._0_4_ + 1.0,0xff808080,0xc,1.0);
  ImDrawList::AddCircle(pIVar7,&local_168,(float)local_1c8._0_4_,0xffffffff,0xc,1.0);
  if (local_158 == 0x10000) {
    fVar17 = out_r[1].y;
    _local_198 = ZEXT416((uint)fVar17);
    fVar21 = 1.0;
    if (fVar17 <= 1.0) {
      fVar21 = fVar17;
    }
    _local_1c8 = ZEXT416((uint)(1.0 - fVar21));
    local_128._8_4_ = local_118 + (float)local_e8._0_4_;
    fStack_11c = local_178 + local_1d8.y;
    local_128._4_4_ = local_1d8.y;
    local_128._0_4_ = local_e8._0_4_;
    p_max.y = fStack_11c;
    p_max.x = (float)local_128._8_4_;
    RenderColorRectWithAlphaCheckerboard
              ((ImVec2)local_128._0_8_,p_max,0,
               ((float)local_128._8_4_ - (float)local_e8._0_4_) * 0.5,(ImVec2)0x0,0.0,-1);
    ImDrawList::AddRectFilledMultiColor
              (pIVar7,(ImVec2 *)local_128,(ImVec2 *)(local_128 + 8),IVar9,IVar9,IVar9 & 0xffffff,
               IVar9 & 0xffffff);
    local_1c8._4_4_ = (float)(int)(float)(~local_198._4_4_ & local_1c8._4_4_);
    local_1c8._0_4_ =
         (float)(int)((float)(-(uint)((float)local_198._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_198._0_4_ < 0.0) & local_1c8._0_4_) * local_178 +
                      local_1d8.y + 0.5);
    uStack_1c0._0_4_ = (uint)(float)(int)(float)(~uStack_190 & (uint)uStack_1c0);
    uStack_1c0._4_4_ = (uint)(float)(int)(float)(~uStack_18c & uStack_1c0._4_4_);
    p_max_00.y = fStack_11c;
    p_max_00.x = (float)local_128._8_4_;
    RenderFrameBorder((ImVec2)local_128._0_8_,p_max_00,0.0);
    pos_00.x = (float)local_e8._0_4_ + -1.0;
    pos_00.y = (float)local_1c8._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar(pIVar7,pos_00,half_sz_00,local_118 + 2.0);
  }
  EndGroup();
  if ((char)local_1f0 != '\0') {
    iVar19 = bcmp(local_58,out_r,local_a8);
    local_1f0 = local_1f0 & 0xff;
    if (iVar19 == 0) {
      local_1f0 = 0;
    }
  }
  bVar13 = (byte)local_1f0;
  if ((local_1f0 & 1) != 0) {
    MarkItemEdited((local_a0->DC).LastItemId);
  }
  PopID();
LAB_0017ef66:
  return (bool)(bVar13 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags__PickerMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__PickerMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__PickerMask;
    if (!(flags & ImGuiColorEditFlags__InputMask))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags__InputMask) ? g.ColorEditOptions : ImGuiColorEditFlags__OptionsDefault) & ImGuiColorEditFlags__InputMask;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__PickerMask)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags__InputMask));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = (float)(int)(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size*0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
    else if (flags & ImGuiColorEditFlags_InputHSV)
        ColorConvertHSVtoRGB(H, S, V, R, G, B);

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner-1)*(wheel_r_inner-1) && initial_dist2 <= (wheel_r_outer+1)*(wheel_r_outer+1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI*0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size-1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context");

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size-1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H >= 1.0f ? H - 10 * 1e-6f : H, S > 0.0f ? S : 10*1e-6f, V > 0.0f ? V : 1e-6f, col[0], col[1], col[2]);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags__DataTypeMask | ImGuiColorEditFlags__InputMask | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differenciating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags__DisplayMask) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    ImVec4 hue_color_f(1, 1, 1, 1); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 col32_no_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, 1.0f));

    const ImU32 hue_colors[6+1] = { IM_COL32(255,0,0,255), IM_COL32(255,255,0,255), IM_COL32(0,255,0,255), IM_COL32(0,255,255,255), IM_COL32(0,0,255,255), IM_COL32(255,0,255,255), IM_COL32(255,0,0,255) };
    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 1.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(IM_COL32_WHITE, false, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, hue_colors[n], hue_colors[n+1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner+wheel_r_outer)*0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad+1, IM_COL32(128,128,128,255), hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, IM_COL32_WHITE, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_WHITE);
        draw_list->PrimVtx(tra, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->PrimVtx(trb, uv_white, IM_COL32_BLACK);
        draw_list->PrimVtx(trc, uv_white, IM_COL32_BLACK_TRANS);
        draw_list->AddTriangle(tra, trb, trc, IM_COL32(128,128,128,255), 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_WHITE, hue_color32, hue_color32, IM_COL32_WHITE);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), IM_COL32_BLACK_TRANS, IM_COL32_BLACK_TRANS, IM_COL32_BLACK, IM_COL32_BLACK);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size,sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp((float)(int)(picker_pos.x + ImSaturate(S)     * sv_picker_size + 0.5f), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp((float)(int)(picker_pos.y + ImSaturate(1 - V) * sv_picker_size + 0.5f), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), hue_colors[i], hue_colors[i], hue_colors[i + 1], hue_colors[i + 1]);
        float bar0_line_y = (float)(int)(picker_pos.y + H * sv_picker_size + 0.5f);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, col32_no_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad+1, IM_COL32(128,128,128,255), 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, IM_COL32_WHITE, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(bar1_bb.Min, bar1_bb.Max, IM_COL32(0,0,0,0), bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, col32_no_alpha, col32_no_alpha, col32_no_alpha & ~IM_COL32_A_MASK, col32_no_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = (float)(int)(picker_pos.y + (1.0f - alpha) * sv_picker_size + 0.5f);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed)
        MarkItemEdited(window->DC.LastItemId);

    PopID();

    return value_changed;
}